

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

statement_ptr __thiscall
mjs::parser::
make_statement<mjs::do_statement,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
          (parser *this,unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *args,
          unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *args_1)

{
  do_statement *this_00;
  statement_ptr *in_RCX;
  source_extend local_48;
  undefined1 local_29;
  statement_ptr *local_28;
  unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *args_local_1;
  unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *args_local;
  parser *this_local;
  statement_ptr *s;
  
  args_local_1 = args_1;
  args_local = args;
  this_local = this;
  if (args[0xe]._M_t.super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
      _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
      super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl == (expression *)0x0) {
    __assert_fail("statement_pos_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                  ,0x147,
                  "statement_ptr mjs::parser::make_statement(Args &&...) [T = mjs::do_statement, Args = <std::unique_ptr<mjs::expression>, std::unique_ptr<mjs::statement>>]"
                 );
  }
  local_29 = 0;
  local_28 = in_RCX;
  this_00 = (do_statement *)operator_new(0x30);
  position_stack_node::extend
            (&local_48,
             (position_stack_node *)
             args[0xe]._M_t.
             super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
             super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
             super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl);
  do_statement::do_statement(this_00,&local_48,(expression_ptr *)args_local_1,local_28);
  std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>::
  unique_ptr<std::default_delete<mjs::statement>,void>
            ((unique_ptr<mjs::statement,std::default_delete<mjs::statement>> *)this,(pointer)this_00
            );
  source_extend::~source_extend(&local_48);
  return (__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)
         (__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)this;
}

Assistant:

statement_ptr make_statement(Args&&... args) {
        assert(statement_pos_);
        auto s = statement_ptr{new T{statement_pos_->extend(), std::forward<Args>(args)...}};
#ifdef PARSER_DEBUG
        std::wcout << s->extend() << " Producting: " << *s << "\n";
#endif
        return s;
    }